

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

string * __thiscall toml::detail::sequence::name_abi_cxx11_(sequence *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  scanner_storage *other;
  const_iterator __end2;
  const_iterator __begin2;
  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *__range2;
  string *n;
  string *this_00;
  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *this_01;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
  local_38;
  size_type *local_30;
  undefined1 local_11;
  
  local_11 = 0;
  this_01 = (vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&stack0xffffffffffffffee;
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffee);
  local_30 = &in_RSI->_M_string_length;
  local_38._M_current =
       (scanner_storage *)
       std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
       begin((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
              *)in_RDI);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::end
            ((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
              *)in_RDI);
  while (bVar1 = __gnu_cxx::
                 operator==<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
                           ((__normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
                             *)in_RSI,
                            (__normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
                             *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
    ::operator*(&local_38);
    scanner_storage::name_abi_cxx11_((scanner_storage *)this_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_RSI,in_RDI);
    std::__cxx11::string::~string(in_RSI);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_RSI,(char *)in_RDI);
    __gnu_cxx::
    __normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
    ::operator++(&local_38);
  }
  bVar1 = std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::empty(this_01);
  if (!bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (in_RSI);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (in_RSI);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_RSI,(char *)in_RDI);
  return in_RDI;
}

Assistant:

TOML11_INLINE std::string sequence::name() const
{
    std::string n("sequence{");
    for(const auto& other : others_)
    {
        n += other.name();
        n += ", ";
    }
    if( ! this->others_.empty())
    {
        n.pop_back();
        n.pop_back();
    }
    n += "}";
    return n;
}